

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

adt_error_t adt_ary_sort(adt_ary_t *self,adt_vlt_func_t *key,_Bool reverse)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  adt_error_t aVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  aVar7 = '\x01';
  if (key != (adt_vlt_func_t *)0x0 && self != (adt_ary_t *)0x0) {
    iVar1 = self->s32CurLen;
    if (iVar1 < 2) {
LAB_0011f08f:
      aVar7 = '\0';
    }
    else {
      iVar9 = 1;
      do {
        if (iVar1 <= iVar9) goto LAB_0011f08f;
        pvVar2 = self->pFirst[(long)iVar9 + -1];
        pvVar3 = self->pFirst[iVar9];
        uVar10 = iVar9 - 1;
        uVar8 = (*key)(pvVar2,pvVar3);
        if ((int)uVar8 < 0) {
LAB_0011efc0:
          bVar6 = false;
        }
        else {
          if (reverse) {
            uVar8 = (uint)(uVar8 == 0);
          }
          if (uVar8 == 0) {
            self->pFirst[iVar9] = pvVar2;
            bVar4 = 1 < iVar9;
            if (1 < iVar9) {
              bVar4 = true;
              lVar11 = (ulong)uVar10 + 1;
              do {
                pvVar2 = self->pFirst[lVar11 + -2];
                uVar8 = (*key)(pvVar2,pvVar3);
                if ((int)uVar8 < 0) goto LAB_0011efc0;
                if (reverse) {
                  uVar8 = (uint)(uVar8 == 0);
                }
                if (uVar8 != 0) {
                  self->pFirst[lVar11 + -1] = pvVar3;
                  iVar9 = iVar9 + 1;
                  goto LAB_0011f06b;
                }
                self->pFirst[lVar11 + -1] = pvVar2;
                lVar12 = lVar11 + -1;
                uVar10 = uVar10 - 1;
                lVar5 = lVar11 + -3;
                bVar4 = 1 < lVar12;
                lVar11 = lVar12;
              } while (SBORROW8(lVar12,2) == lVar5 < 0);
              bVar4 = false;
            }
LAB_0011f06b:
            bVar6 = true;
            if (!bVar4) {
              if (uVar10 != 0) {
                __assert_fail("i == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                              ,0x253,
                              "adt_error_t adt_ary_insertion_sort(adt_ary_t *, adt_vlt_func_t *, _Bool)"
                             );
              }
              *self->pFirst = pvVar3;
              iVar9 = iVar9 + 1;
            }
          }
          else {
            iVar9 = iVar9 + 1;
            bVar6 = true;
          }
        }
      } while (bVar6);
      aVar7 = '\b';
    }
  }
  return aVar7;
}

Assistant:

adt_error_t adt_ary_sort(adt_ary_t *self, adt_vlt_func_t *key, bool reverse)
{
   if ( (self == 0) || (key == 0) )
   {
      return ADT_INVALID_ARGUMENT_ERROR;
   }
   ///TODO: For now we simply use insertion sort. Will need to implement Timsort later on.
   return adt_ary_insertion_sort(self, key, reverse);
}